

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form3_Minimum(MinimumForm3 Minimum)

{
  byte bVar1;
  value_type vVar2;
  value_type vVar3;
  anon_class_8_1_a81546ea __f;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  bool bVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  byte *pbVar8;
  code *in_RDI;
  Image output;
  uint32_t roiHeight;
  uint32_t roiWidth;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiY;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiX;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  undefined4 in_stack_fffffffffffffe88;
  value_type height;
  uint32_t in_stack_fffffffffffffe8c;
  uint8_t value;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *in_stack_fffffffffffffea0;
  bool local_14a;
  uint32_t *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  value_type vVar9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *x;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *image;
  undefined1 local_d0 [40];
  undefined4 local_a8;
  undefined4 local_a4;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  local_a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *local_70;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *local_58;
  uchar *local_50;
  uchar *local_48;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  local_40;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  code *local_10;
  
  local_10 = in_RDI;
  Unit_Test::intensityArray(in_stack_fffffffffffffe8c);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::vector((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
            *)0x1dce5f);
  local_48 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  local_50 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  __first._M_current._4_4_ = in_stack_fffffffffffffe9c;
  __first._M_current._0_4_ = in_stack_fffffffffffffe98;
  __last._M_current._4_4_ = in_stack_fffffffffffffe94;
  __last._M_current._0_4_ = in_stack_fffffffffffffe90;
  __f.input._4_4_ = in_stack_fffffffffffffe8c;
  __f.input._0_4_ = in_stack_fffffffffffffe88;
  local_58 = &local_40;
  local_70 = (vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
              *)std::
                for_each<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,Function_Template::form3_Minimum(PenguinV_Image::ImageTemplate<unsigned_char>(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,unsigned_int,unsigned_int))::__0>
                          (__first,__last,__f);
  x = &local_88;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1dcee8);
  image = &local_a0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1dcefd);
  Unit_Test::generateRoi
            (image,x,in_stack_ffffffffffffff00,
             (uint32_t *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
             in_stack_fffffffffffffef0);
  pvVar5 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](&local_40,0);
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_88,0);
  vVar2 = *pvVar6;
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a0,0);
  vVar3 = *pvVar6;
  pvVar7 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](&local_40,1);
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_88,1);
  vVar9 = *pvVar6;
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a0,1);
  height = *pvVar6;
  (*local_10)(local_d0,pvVar5,vVar2,vVar3,pvVar7,vVar9,height,local_a4,local_a8);
  bVar4 = Unit_Test::equalSize
                    ((Image *)CONCAT44(in_stack_fffffffffffffe94,local_a4),in_stack_fffffffffffffe8c
                     ,height);
  value = (uint8_t)(in_stack_fffffffffffffe8c >> 0x18);
  local_14a = false;
  if (bVar4) {
    pbVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_28,0);
    bVar1 = *pbVar8;
    pbVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_28,1);
    if (bVar1 < *pbVar8) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_28,0);
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_28,1);
    }
    local_14a = Unit_Test::verifyImage((Image *)CONCAT44(in_stack_fffffffffffffe94,local_a4),value);
  }
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1dd0f1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffea0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffea0);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector(in_stack_fffffffffffffea0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffea0);
  return local_14a;
}

Assistant:

bool form3_Minimum(MinimumForm3 Minimum)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        std::vector < PenguinV_Image::Image > input;

        std::for_each( intensity.begin(), intensity.end(), [&]( uint8_t value )
        { input.push_back( uniformImage( value ) ); } );

        std::vector < uint32_t > roiX, roiY;
        uint32_t roiWidth, roiHeight;
        generateRoi( input, roiX, roiY, roiWidth, roiHeight );

        const PenguinV_Image::Image output = Minimum( input[0], roiX[0], roiY[0], input[1], roiX[1], roiY[1], roiWidth, roiHeight );

        return equalSize( output, roiWidth, roiHeight ) &&
            verifyImage( output, intensity[0] < intensity[1] ? intensity[0] : intensity[1] );
    }